

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O0

void emit_op_forprep(function *fn,int A,int pc,int pc1)

{
  int pc1_local;
  int pc_local;
  int A_local;
  function *fn_local;
  
  if (fn->locals[A] == '\0') {
    fn->locals[A] = '\x01';
    membuff_add_fstring(&fn->prologue,"lua_Integer i_%d = 0;\n",(ulong)(uint)A);
    membuff_add_fstring(&fn->prologue,"lua_Integer limit_%d = 0;\n",(ulong)(uint)A);
    membuff_add_fstring(&fn->prologue,"lua_Integer step_%d = 0;\n",(ulong)(uint)A);
    membuff_add_fstring(&fn->prologue,"lua_Number ninit_%d = 0.0;\n",(ulong)(uint)A);
    membuff_add_fstring(&fn->prologue,"lua_Number nlimit_%d = 0.0;\n",(ulong)(uint)A);
    membuff_add_fstring(&fn->prologue,"lua_Number nstep_%d = 0.0;\n",(ulong)(uint)A);
    membuff_add_fstring(&fn->prologue,"int intloop_%d = 0;\n",(ulong)(uint)A);
  }
  emit_reg(fn,"ra",A);
  membuff_add_string(&fn->body,"rb = ra+1; /*limit*/\n");
  membuff_add_string(&fn->body,"rc = ra+2; /*step*/\n");
  membuff_add_fstring(&fn->body,"if (ttisinteger(ra) && ttisinteger(rc) && ttisinteger(rb)) {\n",
                      (ulong)(uint)A);
  membuff_add_fstring(&fn->body," limit_%d = ivalue(rb);\n",(ulong)(uint)A);
  membuff_add_fstring(&fn->body," i_%d = ivalue(ra);\n",(ulong)(uint)A);
  membuff_add_fstring(&fn->body," step_%d = ivalue(rc);\n",(ulong)(uint)A);
  membuff_add_fstring(&fn->body," i_%d -= step_%d;\n",(ulong)(uint)A,(ulong)(uint)A);
  membuff_add_fstring(&fn->body," intloop_%d = 1;\n",(ulong)(uint)A);
  membuff_add_string(&fn->body,"}\n");
  membuff_add_string(&fn->body,"else {\n");
  membuff_add_fstring(&fn->body," if (!ttisnumber(rb)) {\n",(ulong)(uint)A);
  membuff_add_fstring(&fn->body,"  error_code = %d;\n",10);
  membuff_add_string(&fn->body,"  goto Lraise_error;\n");
  membuff_add_string(&fn->body," }\n");
  membuff_add_fstring(&fn->body," if (!ttisnumber(rc)) {\n",(ulong)(uint)A);
  membuff_add_fstring(&fn->body,"  error_code = %d;\n",0xb);
  membuff_add_string(&fn->body,"  goto Lraise_error;\n");
  membuff_add_string(&fn->body," }\n");
  membuff_add_fstring(&fn->body," if (!ttisnumber(ra)) {\n",(ulong)(uint)A);
  membuff_add_fstring(&fn->body,"  error_code = %d;\n",0xc);
  membuff_add_string(&fn->body,"  goto Lraise_error;\n");
  membuff_add_string(&fn->body," }\n");
  membuff_add_fstring(&fn->body," tonumberns(rb, nlimit_%d);\n",(ulong)(uint)A);
  membuff_add_fstring(&fn->body," tonumberns(ra, ninit_%d);\n",(ulong)(uint)A);
  membuff_add_fstring(&fn->body," tonumberns(rc, nstep_%d);\n",(ulong)(uint)A);
  membuff_add_fstring(&fn->body," ninit_%d -= nstep_%d;\n",(ulong)(uint)A,(ulong)(uint)A);
  membuff_add_fstring(&fn->body," intloop_%d = 0;\n",(ulong)(uint)A);
  membuff_add_string(&fn->body,"}\n");
  membuff_add_fstring(&fn->body,"goto Lbc_%d;\n",(ulong)(uint)pc);
  return;
}

Assistant:

static void emit_op_forprep(struct function *fn, int A, int pc, int pc1) {
  (void)pc1;
  if (!fn->locals[A]) {
    fn->locals[A] = 1;  // Lua can reuse the same forloop vars if loop isn't nested
    membuff_add_fstring(&fn->prologue, "lua_Integer i_%d = 0;\n", A);
    membuff_add_fstring(&fn->prologue, "lua_Integer limit_%d = 0;\n", A);
    membuff_add_fstring(&fn->prologue, "lua_Integer step_%d = 0;\n", A);
    membuff_add_fstring(&fn->prologue, "lua_Number ninit_%d = 0.0;\n", A);
    membuff_add_fstring(&fn->prologue, "lua_Number nlimit_%d = 0.0;\n", A);
    membuff_add_fstring(&fn->prologue, "lua_Number nstep_%d = 0.0;\n", A);
    membuff_add_fstring(&fn->prologue, "int intloop_%d = 0;\n", A);
  }
  emit_reg(fn, "ra", A);  // init
  membuff_add_string(&fn->body, "rb = ra+1; /*limit*/\n");
  membuff_add_string(&fn->body, "rc = ra+2; /*step*/\n");
  membuff_add_fstring(&fn->body, "if (ttisinteger(ra) && ttisinteger(rc) && ttisinteger(rb)) {\n", A);
  membuff_add_fstring(&fn->body, " limit_%d = ivalue(rb);\n", A);
  membuff_add_fstring(&fn->body, " i_%d = ivalue(ra);\n", A);
  membuff_add_fstring(&fn->body, " step_%d = ivalue(rc);\n", A);
  membuff_add_fstring(&fn->body, " i_%d -= step_%d;\n", A, A);
  membuff_add_fstring(&fn->body, " intloop_%d = 1;\n", A);
  membuff_add_string(&fn->body, "}\n");
  membuff_add_string(&fn->body, "else {\n");
  membuff_add_fstring(&fn->body, " if (!ttisnumber(rb)) {\n", A);
#if GOTO_ON_ERROR
  // membuff_add_string(&fn->body,  "  ravi_dump_value(L, rb);\n");
  membuff_add_fstring(&fn->body, "  error_code = %d;\n", Error_for_limit_must_be_number);
  membuff_add_string(&fn->body, "  goto Lraise_error;\n");
#else
  membuff_add_fstring(&fn->body, " raviV_raise_error(L, %d);\n", Error_for_limit_must_be_number);
#endif
  membuff_add_string(&fn->body, " }\n");
  membuff_add_fstring(&fn->body, " if (!ttisnumber(rc)) {\n", A);
#if GOTO_ON_ERROR
  membuff_add_fstring(&fn->body, "  error_code = %d;\n", Error_for_step_must_be_number);
  membuff_add_string(&fn->body, "  goto Lraise_error;\n");
#else
  membuff_add_fstring(&fn->body, " raviV_raise_error(L, %d);\n", Error_for_step_must_be_number);
#endif
  membuff_add_string(&fn->body, " }\n");
  membuff_add_fstring(&fn->body, " if (!ttisnumber(ra)) {\n", A);
#if GOTO_ON_ERROR
  membuff_add_fstring(&fn->body, "  error_code = %d;\n", Error_for_initial_value_must_be_number);
  membuff_add_string(&fn->body, "  goto Lraise_error;\n");
#else
  membuff_add_fstring(&fn->body, " raviV_raise_error(L, %d);\n", Error_for_initial_value_must_be_number);
#endif
  membuff_add_string(&fn->body, " }\n");
  membuff_add_fstring(&fn->body, " tonumberns(rb, nlimit_%d);\n", A);
  membuff_add_fstring(&fn->body, " tonumberns(ra, ninit_%d);\n", A);
  membuff_add_fstring(&fn->body, " tonumberns(rc, nstep_%d);\n", A);
  membuff_add_fstring(&fn->body, " ninit_%d -= nstep_%d;\n", A, A);
  membuff_add_fstring(&fn->body, " intloop_%d = 0;\n", A);
  membuff_add_string(&fn->body, "}\n");
  membuff_add_fstring(&fn->body, "goto Lbc_%d;\n", pc);
}